

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O2

double __thiscall
FactoredDecPOMDPDiscrete::GetReward(FactoredDecPOMDPDiscrete *this,Index sI,Index jaI)

{
  ulong uVar1;
  Index e;
  ulong uVar2;
  double in_XMM0_Qa;
  double dVar3;
  double local_30;
  
  if (this->_m_cached_FlatRM != false) {
    (**(this->_m_p_rModel->super_RewardModelDiscreteInterface).super_QTableInterface.
       _vptr_QTableInterface)(this->_m_p_rModel,sI,(ulong)jaI);
    return in_XMM0_Qa;
  }
  uVar2 = 0;
  local_30 = 0.0;
  while( true ) {
    uVar1 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                   super_MultiAgentDecisionProcess + 0x278))(this);
    if (uVar1 <= uVar2) break;
    dVar3 = (double)(**(code **)(*(long *)&(this->
                                           super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                           super_MultiAgentDecisionProcess + 0x268))
                              (this,uVar2,sI,jaI);
    uVar2 = (ulong)((int)uVar2 + 1);
    local_30 = local_30 + dVar3;
  }
  return local_30;
}

Assistant:

double FactoredDecPOMDPDiscrete::GetReward(Index sI, Index jaI) const
{
    if(_m_cached_FlatRM)
        return _m_p_rModel->Get(sI,jaI);

    //sum over local reward functions
    double r = 0.0;
    for(Index e=0; e < GetNrLRFs(); e++)
    {
        double this_e_r = GetLRFRewardFlat(e, sI, jaI);
        r += this_e_r;
    }
    return(r);
}